

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O2

void ihevc_itrans_16x16(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                       WORD32 i4_shift,WORD32 zero_cols)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  undefined4 in_register_00000084;
  long lVar13;
  int iVar14;
  long lVar15;
  WORD32 eo [4];
  WORD32 e [8];
  WORD32 o [8];
  int local_148 [10];
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  undefined8 local_a0;
  ulong local_98;
  short *local_90;
  int aiStack_88 [4];
  int aiStack_78 [8];
  int aiStack_58 [2];
  WORD32 eeo [2];
  WORD32 eee [2];
  WORD32 ee [4];
  
  bVar10 = (byte)i4_shift;
  iVar14 = 1 << (bVar10 - 1 & 0x1f);
  local_b8 = (long)(src_strd * 3);
  local_c0 = (long)(src_strd * 5);
  local_c8 = (long)(src_strd * 7);
  local_d0 = (long)(src_strd * 9);
  local_d8 = (long)(src_strd * 0xb);
  local_e0 = (long)(src_strd * 0xd);
  local_e8 = (long)(src_strd * 0xf);
  local_f0 = (long)(src_strd * 2);
  local_f8 = (long)(src_strd * 6);
  local_100 = (long)(src_strd * 10);
  local_108 = (long)(src_strd * 0xe);
  local_110 = (long)(src_strd * 4);
  local_118 = (long)(src_strd * 0xc);
  local_b0 = (long)src_strd;
  local_120 = (long)(src_strd * 8);
  lVar13 = (long)dst_strd * 2;
  local_a0 = CONCAT44(in_register_00000084,i4_shift);
  local_a8 = lVar13;
  local_90 = pi2_src;
  for (local_98 = 0; (int)local_98 != 0x10; local_98 = (ulong)((int)local_98 + 1)) {
    if ((zero_cols & 1U) == 0) {
      sVar1 = local_90[src_strd];
      sVar2 = local_90[src_strd * 3];
      sVar3 = local_90[src_strd * 5];
      sVar4 = local_90[src_strd * 7];
      sVar5 = local_90[src_strd * 9];
      sVar6 = local_90[src_strd * 0xb];
      sVar7 = local_90[src_strd * 0xd];
      sVar8 = local_90[src_strd * 0xf];
      for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
        aiStack_58[lVar13] =
             (int)g_ai2_ihevc_trans_16[0xf][lVar13] * (int)sVar8 +
             (int)g_ai2_ihevc_trans_16[0xd][lVar13] * (int)sVar7 +
             (int)g_ai2_ihevc_trans_16[0xb][lVar13] * (int)sVar6 +
             (int)g_ai2_ihevc_trans_16[9][lVar13] * (int)sVar5 +
             (int)g_ai2_ihevc_trans_16[7][lVar13] * (int)sVar4 +
             (int)g_ai2_ihevc_trans_16[5][lVar13] * (int)sVar3 +
             (int)g_ai2_ihevc_trans_16[3][lVar13] * (int)sVar2 +
             (int)g_ai2_ihevc_trans_16[1][lVar13] * (int)sVar1;
      }
      sVar1 = local_90[src_strd * 2];
      sVar2 = local_90[src_strd * 6];
      sVar3 = local_90[src_strd * 10];
      sVar4 = local_90[src_strd * 0xe];
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        aiStack_88[lVar13] =
             (int)g_ai2_ihevc_trans_16[0xe][lVar13] * (int)sVar4 +
             (int)g_ai2_ihevc_trans_16[10][lVar13] * (int)sVar3 +
             (int)g_ai2_ihevc_trans_16[6][lVar13] * (int)sVar2 +
             (int)g_ai2_ihevc_trans_16[2][lVar13] * (int)sVar1;
      }
      local_148[0] = local_90[src_strd * 0xc] * 0x24 + local_90[src_strd * 4] * 0x53;
      local_148[2] = local_90[src_strd * 8] * 0x40 + *local_90 * 0x40;
      local_148[1] = local_90[src_strd * 0xc] * -0x53 + local_90[src_strd * 4] * 0x24;
      local_148[3] = local_90[src_strd * 8] * -0x40 + *local_90 * 0x40;
      lVar13 = 4;
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 4) {
        iVar12 = *(int *)((long)local_148 + lVar13 + 8);
        iVar9 = *(int *)((long)local_148 + lVar13);
        *(int *)((long)local_148 + lVar11 + 0x10) =
             *(int *)((long)local_148 + lVar11) + *(int *)((long)local_148 + lVar11 + 8);
        *(int *)((long)local_148 + lVar11 + 0x18) = iVar12 - iVar9;
        lVar13 = lVar13 + -4;
      }
      lVar13 = 0xc;
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 4) {
        iVar12 = *(int *)((long)local_148 + lVar13 + 0x10);
        iVar9 = *(int *)((long)aiStack_88 + lVar13);
        *(int *)((long)aiStack_78 + lVar11) =
             *(int *)((long)aiStack_88 + lVar11) + *(int *)((long)local_148 + lVar11 + 0x10);
        *(int *)((long)aiStack_78 + lVar11 + 0x10) = iVar12 - iVar9;
        lVar13 = lVar13 + -4;
      }
      lVar15 = 0x1c;
      for (lVar11 = 0; lVar13 = local_a8, lVar11 != 0x10; lVar11 = lVar11 + 2) {
        iVar12 = *(int *)((long)aiStack_78 + lVar11 * 2) + iVar14 +
                 *(int *)((long)aiStack_58 + lVar11 * 2) >> (bVar10 & 0x1f);
        if (iVar12 < -0x7fff) {
          iVar12 = -0x8000;
        }
        if (0x7ffe < iVar12) {
          iVar12 = 0x7fff;
        }
        *(short *)((long)pi2_dst + lVar11) = (short)iVar12;
        iVar12 = (*(int *)((long)aiStack_78 + lVar15) + iVar14) -
                 *(int *)((long)aiStack_58 + lVar15) >> (bVar10 & 0x1f);
        if (iVar12 < -0x7fff) {
          iVar12 = -0x8000;
        }
        if (0x7ffe < iVar12) {
          iVar12 = 0x7fff;
        }
        *(short *)((long)pi2_dst + lVar11 + 0x10) = (short)iVar12;
        lVar15 = lVar15 + -4;
      }
    }
    else {
      pi2_dst[8] = 0;
      pi2_dst[9] = 0;
      pi2_dst[10] = 0;
      pi2_dst[0xb] = 0;
      pi2_dst[0xc] = 0;
      pi2_dst[0xd] = 0;
      pi2_dst[0xe] = 0;
      pi2_dst[0xf] = 0;
      pi2_dst[0] = 0;
      pi2_dst[1] = 0;
      pi2_dst[2] = 0;
      pi2_dst[3] = 0;
      pi2_dst[4] = 0;
      pi2_dst[5] = 0;
      pi2_dst[6] = 0;
      pi2_dst[7] = 0;
    }
    local_90 = local_90 + 1;
    pi2_dst = (WORD16 *)((long)pi2_dst + lVar13);
    zero_cols = zero_cols >> 1;
  }
  return;
}

Assistant:

void ihevc_itrans_16x16(WORD16 *pi2_src,
                        WORD16 *pi2_dst,
                        WORD32 src_strd,
                        WORD32 dst_strd,
                        WORD32 i4_shift,
                        WORD32 zero_cols)
{
    WORD32 j, k;
    WORD32 e[8], o[8];
    WORD32 ee[4], eo[4];
    WORD32 eee[2], eeo[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_16; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_16 * sizeof(WORD16));
        }
        else
        {
            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            for(k = 0; k < 8; k++)
            {
                o[k] = g_ai2_ihevc_trans_16[1][k] * pi2_src[src_strd]
                                + g_ai2_ihevc_trans_16[3][k]
                                                * pi2_src[3 * src_strd]
                                + g_ai2_ihevc_trans_16[5][k]
                                                * pi2_src[5 * src_strd]
                                + g_ai2_ihevc_trans_16[7][k]
                                                * pi2_src[7 * src_strd]
                                + g_ai2_ihevc_trans_16[9][k]
                                                * pi2_src[9 * src_strd]
                                + g_ai2_ihevc_trans_16[11][k]
                                                * pi2_src[11 * src_strd]
                                + g_ai2_ihevc_trans_16[13][k]
                                                * pi2_src[13 * src_strd]
                                + g_ai2_ihevc_trans_16[15][k]
                                                * pi2_src[15 * src_strd];
            }
            for(k = 0; k < 4; k++)
            {
                eo[k] = g_ai2_ihevc_trans_16[2][k] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_16[6][k]
                                                * pi2_src[6 * src_strd]
                                + g_ai2_ihevc_trans_16[10][k]
                                                * pi2_src[10 * src_strd]
                                + g_ai2_ihevc_trans_16[14][k]
                                                * pi2_src[14 * src_strd];
            }
            eeo[0] = g_ai2_ihevc_trans_16[4][0] * pi2_src[4 * src_strd]
                            + g_ai2_ihevc_trans_16[12][0]
                                            * pi2_src[12 * src_strd];
            eee[0] =
                            g_ai2_ihevc_trans_16[0][0] * pi2_src[0]
                                            + g_ai2_ihevc_trans_16[8][0]
                                                            * pi2_src[8
                                                                            * src_strd];
            eeo[1] = g_ai2_ihevc_trans_16[4][1] * pi2_src[4 * src_strd]
                            + g_ai2_ihevc_trans_16[12][1]
                                            * pi2_src[12 * src_strd];
            eee[1] =
                            g_ai2_ihevc_trans_16[0][1] * pi2_src[0]
                                            + g_ai2_ihevc_trans_16[8][1]
                                                            * pi2_src[8
                                                                            * src_strd];

            /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
            for(k = 0; k < 2; k++)
            {
                ee[k] = eee[k] + eeo[k];
                ee[k + 2] = eee[1 - k] - eeo[1 - k];
            }
            for(k = 0; k < 4; k++)
            {
                e[k] = ee[k] + eo[k];
                e[k + 4] = ee[3 - k] - eo[3 - k];
            }
            for(k = 0; k < 8; k++)
            {
                pi2_dst[k] =
                                CLIP_S16(((e[k] + o[k] + add) >> i4_shift));
                pi2_dst[k + 8] =
                                CLIP_S16(((e[7 - k] - o[7 - k] + add) >> i4_shift));
            }
        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}